

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

void G_ParseMapInfo(FString *basemapinfo)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  undefined1 local_758 [8];
  level_info_t defaultinfo_1;
  FMapInfoParser parse_1;
  int altlump;
  int wad;
  int nindex;
  int baselump;
  level_info_t defaultinfo;
  FMapInfoParser parse;
  undefined1 local_1c8 [8];
  level_info_t gamedefaults;
  int lastlump;
  int lump;
  FString *basemapinfo_local;
  
  gamedefaults.PrecacheClasses.Most = 0;
  level_info_t::level_info_t((level_info_t *)local_1c8);
  ClearMapinfo();
  addterm(ClearMapinfo,"ClearMapinfo");
  bVar1 = FString::IsNotEmpty(basemapinfo);
  if (bVar1) {
    FMapInfoParser::FMapInfoParser((FMapInfoParser *)&defaultinfo.PrecacheClasses.Most,0);
    level_info_t::level_info_t((level_info_t *)&nindex);
    wad = FWadCollection::GetNumForFullName(&Wads,basemapinfo);
    iVar2 = FWadCollection::GetLumpFile(&Wads,wad);
    if (0 < iVar2) {
      iVar2 = FWadCollection::GetLumpFile(&Wads,wad);
      pcVar4 = FWadCollection::GetWadFullName(&Wads,iVar2);
      pcVar5 = FString::GetChars(basemapinfo);
      I_FatalError("File %s is overriding core lump %s.",pcVar4,pcVar5);
    }
    FMapInfoParser::ParseMapInfo
              ((FMapInfoParser *)&defaultinfo.PrecacheClasses.Most,wad,(level_info_t *)local_1c8,
               (level_info_t *)&nindex);
    level_info_t::~level_info_t((level_info_t *)&nindex);
    FMapInfoParser::~FMapInfoParser((FMapInfoParser *)&defaultinfo.PrecacheClasses.Most);
  }
LAB_005d67fa:
  gamedefaults.PrecacheClasses.Count =
       FWadCollection::FindLumpMulti
                 (&Wads,G_ParseMapInfo::mapinfonames,(int *)&gamedefaults.PrecacheClasses.Most,false
                  ,&altlump);
  if (gamedefaults.PrecacheClasses.Count == 0xffffffff) {
    uVar3 = TArray<FEpisode,_FEpisode>::Size(&AllEpisodes);
    if (uVar3 == 0) {
      I_FatalError(
                  "You cannot use clearepisodes in a MAPINFO if you do not define any new episodes after it."
                  );
    }
    uVar3 = TArray<FSkillInfo,_FSkillInfo>::Size(&AllSkills);
    if (uVar3 == 0) {
      I_FatalError(
                  "You cannot use clearskills in a MAPINFO if you do not define any new skills after it."
                  );
    }
    level_info_t::~level_info_t((level_info_t *)local_1c8);
    return;
  }
  if (altlump == 0) goto code_r0x005d683d;
  goto LAB_005d68a5;
code_r0x005d683d:
  iVar2 = FWadCollection::GetLumpFile(&Wads,gamedefaults.PrecacheClasses.Count);
  iVar2 = FWadCollection::CheckNumForName(&Wads,"ZMAPINFO",0,iVar2,true);
  if (iVar2 < 0) {
LAB_005d68a5:
    FMapInfoParser::FMapInfoParser
              ((FMapInfoParser *)&defaultinfo_1.PrecacheClasses.Most,(uint)(altlump == 1) * 2);
    level_info_t::level_info_t((level_info_t *)local_758);
    FMapInfoParser::ParseMapInfo
              ((FMapInfoParser *)&defaultinfo_1.PrecacheClasses.Most,
               gamedefaults.PrecacheClasses.Count,(level_info_t *)local_1c8,
               (level_info_t *)local_758);
    level_info_t::~level_info_t((level_info_t *)local_758);
    FMapInfoParser::~FMapInfoParser((FMapInfoParser *)&defaultinfo_1.PrecacheClasses.Most);
  }
  goto LAB_005d67fa;
}

Assistant:

void G_ParseMapInfo (FString basemapinfo)
{
	int lump, lastlump = 0;
	level_info_t gamedefaults;

	ClearMapinfo();
	atterm(ClearMapinfo);

	// Parse the default MAPINFO for the current game. This lump *MUST* come from zdoom.pk3.
	if (basemapinfo.IsNotEmpty())
	{
		FMapInfoParser parse;
		level_info_t defaultinfo;
		int baselump = Wads.GetNumForFullName(basemapinfo);
		if (Wads.GetLumpFile(baselump) > 0)
		{
			I_FatalError("File %s is overriding core lump %s.", 
				Wads.GetWadFullName(Wads.GetLumpFile(baselump)), basemapinfo.GetChars());
		}
		parse.ParseMapInfo(baselump, gamedefaults, defaultinfo);
	}

	static const char *mapinfonames[] = { "MAPINFO", "ZMAPINFO", NULL };
	int nindex;

	// Parse any extra MAPINFOs.
	while ((lump = Wads.FindLumpMulti (mapinfonames, &lastlump, false, &nindex)) != -1)
	{
		if (nindex == 0)
		{
			// If this lump is named MAPINFO we need to check if the same WAD contains a ZMAPINFO lump.
			// If that exists we need to skip this one.

			int wad = Wads.GetLumpFile(lump);
			int altlump = Wads.CheckNumForName("ZMAPINFO", ns_global, wad, true);

			if (altlump >= 0) continue;
		}
		FMapInfoParser parse(nindex == 1? FMapInfoParser::FMT_New : FMapInfoParser::FMT_Unknown);
		level_info_t defaultinfo;
		parse.ParseMapInfo(lump, gamedefaults, defaultinfo);
	}

	if (AllEpisodes.Size() == 0)
	{
		I_FatalError ("You cannot use clearepisodes in a MAPINFO if you do not define any new episodes after it.");
	}
	if (AllSkills.Size() == 0)
	{
		I_FatalError ("You cannot use clearskills in a MAPINFO if you do not define any new skills after it.");
	}
}